

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O1

void Npn_ManLoad(char *pFileName)

{
  if (pNpnMan != (Npn_Man_t *)0x0) {
    Abc_Print(1,"Removing old table with %d entries.\n",(ulong)(uint)pNpnMan->nEntries);
    Npn_ManStop(pNpnMan);
  }
  pNpnMan = Npn_ManStart(pFileName);
  Abc_Print(1,"Created new table with %d entries from file \"%s\".\n",(ulong)(uint)pNpnMan->nEntries
            ,pFileName);
  return;
}

Assistant:

void Npn_ManLoad( char * pFileName )
{
//    Npn_TruthPermute_rec( "012345", 0, 5 );
    if ( pNpnMan != NULL )
    {
        Abc_Print( 1, "Removing old table with %d entries.\n", pNpnMan->nEntries );
        Npn_ManStop( pNpnMan );
    }
    pNpnMan = Npn_ManStart( pFileName );
    Abc_Print( 1, "Created new table with %d entries from file \"%s\".\n", pNpnMan->nEntries, pFileName );
}